

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O0

void __thiscall
Rml::ControlledLifetimeResource<Rml::ComputedPropertyData>::Initialize
          (ControlledLifetimeResource<Rml::ComputedPropertyData> *this)

{
  code *pcVar1;
  bool bVar2;
  ComputedPropertyData *this_00;
  ControlledLifetimeResource<Rml::ComputedPropertyData> *this_local;
  
  if ((this->pointer != (ComputedPropertyData *)0x0) &&
     (bVar2 = Assert("Resource already initialized.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x2e), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = (ComputedPropertyData *)operator_new(0xf8);
  (this_00->computed).rare.row_gap = 0.0;
  (this_00->computed).rare.column_gap = 0.0;
  (this_00->computed).rare.border_top_left_radius = 0;
  (this_00->computed).rare.border_top_right_radius = 0;
  (this_00->computed).rare.border_bottom_right_radius = 0;
  (this_00->computed).rare.border_bottom_left_radius = 0;
  (this_00->computed).rare.transform_origin_x = 0.0;
  (this_00->computed).rare.transform_origin_y = 0.0;
  (this_00->computed).rare.transform_origin_z = 0.0;
  (this_00->computed).rare.flex_basis = 0.0;
  (this_00->computed).rare.vertical_align_length = 0.0;
  (this_00->computed).rare.perspective = 0.0;
  (this_00->computed).rare.perspective_origin_x = 0.0;
  (this_00->computed).rare.perspective_origin_y = 0.0;
  (this_00->computed).rare.min_width = 0.0;
  (this_00->computed).rare.max_width = 0.0;
  (this_00->computed).rare.min_height = 0.0;
  (this_00->computed).rare.max_height = 0.0;
  *(undefined8 *)((long)&(this_00->computed).inherited.language.field_2 + 8) = 0;
  *(undefined8 *)&(this_00->computed).rare = 0;
  (this_00->computed).inherited.language._M_string_length = 0;
  (this_00->computed).inherited.language.field_2._M_allocated_capacity = 0;
  (this_00->computed).inherited.line_height = 0.0;
  (this_00->computed).inherited.line_height_inherit = 0.0;
  *(undefined8 *)&(this_00->computed).inherited.language = 0;
  (this_00->computed).inherited.font_size = 0.0;
  (this_00->computed).inherited.opacity = 0.0;
  *(undefined8 *)&(this_00->computed).inherited.color = 0;
  (this_00->computed).common.border_left_color.red = '\0';
  (this_00->computed).common.border_left_color.green = '\0';
  (this_00->computed).common.border_left_color.blue = '\0';
  (this_00->computed).common.border_left_color.alpha = '\0';
  (this_00->computed).common.background_color.red = '\0';
  (this_00->computed).common.background_color.green = '\0';
  (this_00->computed).common.background_color.blue = '\0';
  (this_00->computed).common.background_color.alpha = '\0';
  (this_00->computed).inherited.font_face_handle = 0;
  (this_00->computed).common.border_bottom_width = 0;
  (this_00->computed).common.border_left_width = 0;
  (this_00->computed).common.border_top_color.red = '\0';
  (this_00->computed).common.border_top_color.green = '\0';
  (this_00->computed).common.border_top_color.blue = '\0';
  (this_00->computed).common.border_top_color.alpha = '\0';
  (this_00->computed).common.border_right_color.red = '\0';
  (this_00->computed).common.border_right_color.green = '\0';
  (this_00->computed).common.border_right_color.blue = '\0';
  (this_00->computed).common.border_right_color.alpha = '\0';
  (this_00->computed).common.border_bottom_color.red = '\0';
  (this_00->computed).common.border_bottom_color.green = '\0';
  (this_00->computed).common.border_bottom_color.blue = '\0';
  (this_00->computed).common.border_bottom_color.alpha = '\0';
  (this_00->computed).common.bottom_value = 0.0;
  (this_00->computed).common.left_value = 0.0;
  (this_00->computed).common.z_index_value = 0.0;
  (this_00->computed).common.border_top_width = 0;
  (this_00->computed).common.border_right_width = 0;
  (this_00->computed).common.padding_bottom_value = 0.0;
  (this_00->computed).common.padding_left_value = 0.0;
  (this_00->computed).common.top_value = 0.0;
  (this_00->computed).common.right_value = 0.0;
  (this_00->computed).common.margin_bottom_value = 0.0;
  (this_00->computed).common.margin_left_value = 0.0;
  (this_00->computed).common.padding_top_value = 0.0;
  (this_00->computed).common.padding_right_value = 0.0;
  (this_00->computed).common.width_value = 0.0;
  (this_00->computed).common.height_value = 0.0;
  (this_00->computed).common.margin_top_value = 0.0;
  (this_00->computed).common.margin_right_value = 0.0;
  (this_00->computed).element = (Element *)0x0;
  *(undefined8 *)&(this_00->computed).common = 0;
  (this_00->computed).rare.image_color.red = '\0';
  (this_00->computed).rare.image_color.green = '\0';
  (this_00->computed).rare.image_color.blue = '\0';
  (this_00->computed).rare.image_color.alpha = '\0';
  (this_00->computed).rare.scrollbar_margin = 0.0;
  ComputedPropertyData::ComputedPropertyData(this_00);
  this->pointer = this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}